

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall Fossilize::DatabaseInterface::~DatabaseInterface(DatabaseInterface *this)

{
  Impl *this_00;
  DatabaseInterface *this_local;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_00827900;
  if (this->impl->mapped_metadata != (uint8_t *)0x0) {
    munmap(this->impl->mapped_metadata,this->impl->mapped_metadata_size);
  }
  this_00 = this->impl;
  if (this_00 != (Impl *)0x0) {
    Impl::~Impl(this_00);
    operator_delete(this_00,0x290);
  }
  return;
}

Assistant:

DatabaseInterface::~DatabaseInterface()
{
#ifdef _WIN32
	if (impl->mapped_metadata)
		UnmapViewOfFile(impl->mapped_metadata);
#else
	if (impl->mapped_metadata)
		munmap(const_cast<uint8_t *>(impl->mapped_metadata), impl->mapped_metadata_size);
#endif
	delete impl;
}